

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::detail::ReferenceResolver::lookup_(ReferenceResolver *this,refdata *ra)

{
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  bool bVar1;
  error_flags eVar2;
  int iVar3;
  csubstr *pcVar4;
  NodeData *pNVar5;
  ulong *in_RSI;
  undefined8 *in_RDI;
  char errmsg [1024];
  csubstr refname;
  size_t in_stack_fffffffffffff9c8;
  size_t in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  Location *in_stack_fffffffffffff9e0;
  size_t in_stack_fffffffffffffa18;
  Tree *in_stack_fffffffffffffa20;
  size_t in_stack_fffffffffffffa28;
  Tree *in_stack_fffffffffffffa30;
  size_t in_stack_fffffffffffffa38;
  char *in_stack_fffffffffffffa40;
  basic_substring<const_char> *in_stack_fffffffffffffa48;
  size_t in_stack_fffffffffffffa50;
  size_t local_1d8;
  size_t sStack_1d0;
  char *local_1c8;
  Location *pLStack_1c0;
  basic_substring<const_char> local_1b0;
  size_t local_1a0;
  size_t sStack_198;
  char *local_190;
  Location *pLStack_188;
  size_t local_178;
  size_t sStack_170;
  char *local_168;
  Location *pLStack_160;
  ulong *local_150;
  ulong *local_138;
  ulong *local_130;
  ulong *local_120;
  ulong *local_118;
  basic_substring<const_char> *local_108;
  size_t local_100;
  size_t sStack_f8;
  char *local_f0;
  Location *pLStack_e8;
  ulong local_d8;
  undefined8 *local_d0;
  char *local_c8;
  ulong local_c0;
  char *local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  char *local_98;
  ulong local_90;
  char *local_88;
  ulong local_80;
  csubstr *local_78;
  char *local_70;
  ulong local_68;
  char *local_60;
  ulong local_58;
  csubstr *local_50;
  char *local_48;
  ulong local_40;
  basic_substring<const_char> *local_38;
  csubstr *local_30;
  char *local_28;
  ulong local_20;
  csubstr *local_18;
  char *local_10;
  ulong local_8;
  
  local_150 = in_RSI;
  if (((*in_RSI & 0x40) == 0) && ((*in_RSI & 0x80) == 0)) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0
                       ,in_stack_fffffffffffff9c8);
    loc.super_LineCol.line = in_stack_fffffffffffffa38;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffa30;
    loc.super_LineCol.col = (size_t)in_stack_fffffffffffffa40;
    loc.name.str = (char *)in_stack_fffffffffffffa48;
    loc.name.len = in_stack_fffffffffffffa50;
    error<61ul>((char (*) [61])in_stack_fffffffffffffa20,loc);
    in_stack_fffffffffffff9c8 = local_178;
    in_stack_fffffffffffff9d0 = sStack_170;
    in_stack_fffffffffffff9d8 = local_168;
    in_stack_fffffffffffff9e0 = pLStack_160;
  }
  local_130 = local_150;
  local_118 = local_150;
  if (((*local_150 & 0x40) != 0) == ((*local_150 & 0x80) != 0)) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0
                       ,in_stack_fffffffffffff9c8);
    loc_00.super_LineCol.line = in_stack_fffffffffffffa38;
    loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffa30;
    loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffa40;
    loc_00.name.str = (char *)in_stack_fffffffffffffa48;
    loc_00.name.len = in_stack_fffffffffffffa50;
    error<61ul>((char (*) [61])in_stack_fffffffffffffa20,loc_00);
    in_stack_fffffffffffff9c8 = local_1a0;
    in_stack_fffffffffffff9d0 = sStack_198;
    in_stack_fffffffffffff9d8 = local_190;
    in_stack_fffffffffffff9e0 = pLStack_188;
  }
  basic_substring<const_char>::basic_substring(&local_1b0);
  local_120 = local_150;
  if ((*local_150 & 0x80) == 0) {
    local_138 = local_150;
    if ((*local_150 & 0x40) == 0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      loc_01.super_LineCol.line = in_stack_fffffffffffffa38;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffa30;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffa40;
      loc_01.name.str = (char *)in_stack_fffffffffffffa48;
      loc_01.name.len = in_stack_fffffffffffffa50;
      error<36ul>((char (*) [36])in_stack_fffffffffffffa20,loc_01);
      in_stack_fffffffffffff9c8 = local_1d8;
      in_stack_fffffffffffff9d0 = sStack_1d0;
      in_stack_fffffffffffff9d8 = local_1c8;
      in_stack_fffffffffffff9e0 = pLStack_1c0;
    }
    pcVar4 = Tree::key_ref(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    local_1b0.str = pcVar4->str;
    local_1b0.len = pcVar4->len;
  }
  else {
    pcVar4 = Tree::val_ref(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    local_1b0.str = pcVar4->str;
    local_1b0.len = pcVar4->len;
  }
  do {
    if (local_150[2] == 0xffffffffffffffff) {
      local_108 = &local_1b0;
      local_38 = &local_1b0;
      snprintf(&stack0xfffffffffffffa18,0x400,"anchor does not exist: \'%.*s\'",
               local_1b0.len & 0xffffffff,local_1b0.str);
      error<1024ul>((char (*) [1024])in_stack_fffffffffffffa20);
      return 0xffffffffffffffff;
    }
    local_d0 = in_RDI + 1;
    local_d8 = local_150[2];
    if ((ulong)in_RDI[0x62] <= local_d8) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      loc_02.super_LineCol.line = in_stack_fffffffffffffa38;
      loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffa30;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffa40;
      loc_02.name.str = (char *)in_stack_fffffffffffffa48;
      loc_02.name.len = in_stack_fffffffffffffa50;
      in_stack_fffffffffffff9c8 = local_100;
      in_stack_fffffffffffff9d0 = sStack_f8;
      in_stack_fffffffffffff9d8 = local_f0;
      in_stack_fffffffffffff9e0 = pLStack_e8;
      error<25ul>((char (*) [25])in_stack_fffffffffffffa20,loc_02);
    }
    local_150 = (ulong *)(in_RDI[0x61] + local_d8 * 0x30);
    local_a0 = *in_RDI;
    local_a8 = local_150[1];
    local_98 = local_1b0.str;
    local_90 = local_1b0.len;
    pNVar5 = Tree::_p(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    local_50 = &(pNVar5->m_key).anchor;
    local_b8 = local_98;
    local_b0 = local_90;
    local_48 = local_98;
    local_40 = local_90;
    local_60 = local_98;
    local_58 = local_90;
    local_10 = local_98;
    local_8 = local_90;
    local_18 = local_50;
    iVar3 = basic_substring<const_char>::compare
                      (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
                      );
    bVar1 = true;
    if (iVar3 != 0) {
      pNVar5 = Tree::_p(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      local_78 = &(pNVar5->m_val).anchor;
      local_c8 = local_98;
      local_c0 = local_90;
      local_70 = local_98;
      local_68 = local_90;
      local_88 = local_98;
      local_80 = local_90;
      local_28 = local_98;
      local_20 = local_90;
      local_30 = local_78;
      iVar3 = basic_substring<const_char>::compare
                        (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                         in_stack_fffffffffffffa38);
      bVar1 = iVar3 == 0;
    }
  } while (!bVar1);
  return local_150[1];
}

Assistant:

size_t lookup_(refdata *C4_RESTRICT ra)
    {
        RYML_ASSERT(ra->type.is_key_ref() || ra->type.is_val_ref());
        RYML_ASSERT(ra->type.is_key_ref() != ra->type.is_val_ref());
        csubstr refname;
        if(ra->type.is_val_ref())
        {
            refname = t->val_ref(ra->node);
        }
        else
        {
            RYML_ASSERT(ra->type.is_key_ref());
            refname = t->key_ref(ra->node);
        }
        while(ra->prev_anchor != npos)
        {
            ra = &refs[ra->prev_anchor];
            if(t->has_anchor(ra->node, refname))
                return ra->node;
        }

        #ifndef RYML_ERRMSG_SIZE
          #define RYML_ERRMSG_SIZE 1024
        #endif

        char errmsg[RYML_ERRMSG_SIZE];
        snprintf(errmsg, RYML_ERRMSG_SIZE, "anchor does not exist: '%.*s'",
                 static_cast<int>(refname.size()), refname.data());
        c4::yml::error(errmsg);
        return NONE;
    }